

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsValid(ON_Xform *this)

{
  double dVar1;
  double t;
  double *x16;
  double *x;
  ON_Xform *this_local;
  
  x16 = (double *)this;
  do {
    if (this + 1 <= x16) {
      return true;
    }
    dVar1 = *x16;
  } while ((-1.23432101234321e+308 < dVar1) && (x16 = x16 + 1, dVar1 < 1.23432101234321e+308));
  return false;
}

Assistant:

bool ON_Xform::IsValid() const
{
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  while ( x < x16 )
  {
    const double t = *x++;
    if (ON_IS_VALID(t))
      continue;
    return false; // t is not valid
  }
  return true;
}